

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O2

void writeQuotedString(ostream *os,string *str,bool forceQuotes)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  ostream *poVar6;
  undefined7 in_register_00000011;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  string local_1c8 [32];
  ostringstream oss;
  undefined8 uStack_198;
  uint auStack_190 [88];
  
  if (((int)CONCAT71(in_register_00000011,forceQuotes) != 0) ||
     (bVar3 = stringNeedsQuoting(str), bVar3)) {
    std::operator<<(os,'\"');
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  uVar2 = (uint)str->_M_string_length;
  uVar9 = 0;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar7 = uVar9;
  }
  do {
    if (uVar7 == uVar9) {
      if (bVar3) {
        std::operator<<(os,'\"');
      }
      return;
    }
    pbVar5 = (byte *)std::__cxx11::string::at((ulong)str);
    bVar1 = *pbVar5;
    switch(bVar1) {
    case 7:
      pcVar8 = "\\a";
      break;
    case 8:
      pcVar8 = "\\b";
      break;
    case 9:
      pcVar8 = "\\t";
      break;
    case 10:
      pcVar8 = "\\n";
      break;
    case 0xb:
      pcVar8 = "\\v";
      break;
    case 0xc:
      pcVar8 = "\\f";
      break;
    case 0xd:
      pcVar8 = "\\r";
      break;
    default:
      if (bVar1 == 0x5c) {
        pcVar8 = "\\\\";
        break;
      }
      iVar4 = isprint((int)(char)bVar1);
      if ((bVar1 == 0x22) || (iVar4 == 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        *(uint *)((long)auStack_190 + *(long *)(_oss + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(_oss + -0x18)) & 0xffffffb5 | 0x40;
        *(undefined8 *)((long)&uStack_198 + *(long *)(_oss + -0x18)) = 3;
        poVar6 = std::operator<<((ostringstream *)&oss,0x30);
        std::ostream::operator<<((ostream *)poVar6,(uint)bVar1);
        poVar6 = std::operator<<(os,"\\");
        std::__cxx11::stringbuf::str();
        std::operator<<(poVar6,local_1c8);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      }
      else {
        std::operator<<(os,bVar1);
      }
      goto LAB_0010ca61;
    }
    std::operator<<(os,pcVar8);
LAB_0010ca61:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void writeQuotedString(ostream & os, const string & str, bool forceQuotes) {
   if (!forceQuotes && stringNeedsQuoting(str)) forceQuotes = true;
   if (forceQuotes) os << '"';
   int len = str.length();
   for (int i = 0; i < len; i++) {
      char ch = str.at(i);
      switch (ch) {
       case '\a': os << "\\a"; break;
       case '\b': os << "\\b"; break;
       case '\f': os << "\\f"; break;
       case '\n': os << "\\n"; break;
       case '\r': os << "\\r"; break;
       case '\t': os << "\\t"; break;
       case '\v': os << "\\v"; break;
       case '\\': os << "\\\\"; break;
       default:
         if (isprint(ch) && ch != '"') {
            os << ch;
         } else {
            ostringstream oss;
            oss << oct << setw(3) << setfill('0') << (int(ch) & 0xFF);
            os << "\\" << oss.str();
         }
      }
   }
   if (forceQuotes) os << '"';
}